

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsLoadNonMS::Run(BasicAllTargetsLoadNonMS *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  GLuint GVar9;
  GLint GVar10;
  ostream *poVar11;
  size_t sVar12;
  undefined7 extraout_var;
  GLuint GVar13;
  int iVar14;
  GLenum GVar15;
  vec4 *pvVar16;
  char *pcVar17;
  CallLogWrapper *pCVar18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_550;
  byte local_522;
  byte local_521;
  BasicAllTargetsLoadNonMS *local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  size_type local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  GLuint textures [7];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint buffer;
  undefined8 local_4a0;
  char local_498;
  undefined1 uStack_497;
  undefined6 uStack_496;
  Vector<float,_4> local_488;
  long local_478 [2];
  GLchar name [32];
  GLint uniforms;
  undefined8 local_440;
  ulong local_438;
  undefined1 local_430;
  Vector<float,_4> local_428;
  CallLogWrapper *local_410;
  byte local_401;
  ulong *local_400;
  undefined8 local_3f8;
  ulong local_3f0;
  undefined1 local_3e8;
  ulong *local_3e0;
  undefined8 local_3d8;
  ulong local_3d0;
  undefined1 local_3c8;
  ulong *local_3c0;
  undefined8 local_3b8;
  ulong local_3b0;
  undefined1 local_3a8;
  char *local_3a0;
  undefined8 local_398;
  char local_390;
  undefined1 uStack_38f;
  undefined6 uStack_38e;
  char *local_380;
  undefined8 local_378;
  char local_370;
  undefined1 uStack_36f;
  undefined6 uStack_36e;
  char *local_360;
  undefined8 local_358;
  char local_350;
  undefined1 uStack_34f;
  undefined6 uStack_34e;
  char *local_340;
  undefined8 local_338;
  char local_330;
  undefined1 uStack_32f;
  undefined6 uStack_32e;
  char *local_320;
  undefined8 local_318;
  char local_310;
  undefined1 uStack_30f;
  undefined6 uStack_30e;
  char *local_300;
  undefined8 local_2f8;
  char local_2f0;
  undefined1 uStack_2ef;
  undefined6 uStack_2ee;
  char *local_2e0;
  undefined8 local_2d8;
  char local_2d0;
  undefined1 uStack_2cf;
  undefined6 uStack_2ce;
  char *local_2c0;
  undefined8 local_2b8;
  char local_2b0;
  undefined1 uStack_2af;
  undefined6 uStack_2ae;
  char *local_2a0;
  undefined8 local_298;
  char local_290;
  undefined1 uStack_28f;
  undefined6 uStack_28e;
  char *local_280;
  undefined8 local_278;
  char local_270;
  undefined1 uStack_26f;
  undefined6 uStack_26e;
  char *local_260;
  undefined8 local_258;
  char local_250;
  undefined1 uStack_24f;
  undefined6 uStack_24e;
  char *local_240;
  undefined8 local_238;
  char local_230;
  undefined1 uStack_22f;
  undefined6 uStack_22e;
  char *local_220;
  undefined8 local_218;
  char local_210;
  undefined1 uStack_20f;
  undefined6 uStack_20e;
  char *local_200;
  undefined8 local_1f8;
  char local_1f0;
  undefined1 uStack_1ef;
  undefined6 uStack_1ee;
  GLuint *local_1e0;
  value_type local_1d8;
  char local_1c8;
  undefined1 uStack_1c7;
  undefined6 uStack_1c6;
  value_type local_1b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  ios_base local_138 [264];
  
  local_1e0 = &this->m_vao;
  local_520 = this;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,local_1e0,&this->m_vbo,(GLuint *)0x0);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = 10.0;
  local_1b8.m_data[2] = -200.0;
  local_1b8.m_data[3] = 3000.0;
  local_428.m_data[0] = -1.0;
  local_428.m_data[1] = 10.0;
  local_428.m_data[2] = -200.0;
  local_428.m_data[3] = 3000.0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_550.first.field_2._M_local_buf[6] = 'f';
  local_550.first._M_string_length = 7;
  local_550.first.field_2._M_local_buf[7] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_550.first._M_dataplus._M_p,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)name._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image1D g_image_1d;\nlayout(",0x1b);
  local_518 = &local_508;
  local_510 = 7;
  local_508._M_allocated_capacity = 0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_518->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[2] = 0;
  textures[3] = 0;
  textures[4]._0_1_ = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)textures._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image2D g_image_2d;\nlayout(",0x1b);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x7;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  _buffer = &local_498;
  local_4a0 = 0;
  local_498 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,_buffer,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image3D g_image_3d;\nlayout(",0x1b);
  _uniforms = &local_438;
  local_440 = 7;
  local_438 = 0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)_uniforms,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_220 = &local_210;
  local_218 = 0;
  local_210 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_220,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"image2DRect g_image_2drect;\nlayout(",0x23);
  local_3c0 = &local_3b0;
  local_3b8 = 7;
  local_3b0 = 0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3c0,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_240 = &local_230;
  local_238 = 0;
  local_230 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_240,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"imageBuffer g_image_buffer;\nlayout(",0x23);
  local_3e0 = &local_3d0;
  local_3d8 = 7;
  local_3d0 = 0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3e0,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_260 = &local_250;
  local_258 = 0;
  local_250 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_260,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_400 = &local_3f0;
  local_3f8 = 7;
  local_3f0 = 0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_400,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_280 = &local_270;
  local_278 = 0;
  local_270 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_280,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x7c);
  local_2a0 = &local_290;
  local_298 = 0;
  local_290 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2a0,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ",0x39);
  local_2c0 = &local_2b0;
  local_2b8 = 0;
  local_2b0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2c0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
             ,0x56);
  local_2e0 = &local_2d0;
  local_2d8 = 0;
  local_2d0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2e0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
             ,0x62);
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_300,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
             ,99);
  local_320 = &local_310;
  local_318 = 0;
  local_310 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_320,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
             ,0x59);
  local_340 = &local_330;
  local_338 = 0;
  local_330 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_340,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
             ,0x5c);
  local_360 = &local_350;
  local_358 = 0;
  local_350 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_360,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
             ,0x66);
  local_380 = &local_370;
  local_378 = 0;
  local_370 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_380,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
             ,0x67);
  local_3a0 = &local_390;
  local_398 = 0;
  local_390 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
             ,100);
  local_200 = &local_1f0;
  local_1f8 = 0;
  local_1f0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_200,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
             ,0x65);
  local_1d8.m_data._0_8_ = &local_1c8;
  local_1d8.m_data[2] = 0.0;
  local_1d8.m_data[3] = 0.0;
  local_1c8 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_1d8.m_data._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}",0x27);
  if ((char *)local_1d8.m_data._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8.m_data._0_8_,
                    CONCAT62(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)) + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT62(uStack_38e,CONCAT11(uStack_38f,local_390)) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT62(uStack_36e,CONCAT11(uStack_36f,local_370)) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
  }
  if (_uniforms != &local_438) {
    operator_delete(_uniforms,local_438 + 1);
  }
  if (_buffer != &local_498) {
    operator_delete(_buffer,CONCAT62(uStack_496,CONCAT11(uStack_497,local_498)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var2 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar9 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_520->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_488.m_data._0_8_,(bool *)0x0
                    );
  if ((long *)local_488.m_data._0_8_ != local_478) {
    operator_delete((void *)local_488.m_data._0_8_,local_478[0] + 1);
  }
  pCVar18 = &(local_520->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(pCVar18,7,textures);
  glu::CallLogWrapper::glGenBuffers(pCVar18,1,&buffer);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x200,&local_1b8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D
            (pCVar18,0xde0,0,0x8814,0x10,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde0,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0xde1,0,0x8814,0x10,0x10,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde1,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x806f,0,0x8814,0x10,0x10,2,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x806f,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x84f5,0,0x8814,0x10,0x10,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x84f5,0);
  glu::CallLogWrapper::glBindBuffer(pCVar18,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData
            (pCVar18,0x8c2a,0x100,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(pCVar18,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x8c2a,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])));
  glu::CallLogWrapper::glTexBuffer(pCVar18,0x8c2a,0x8814,buffer);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c18,textures[5]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8c18,0,0x8814,0x10,2,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c1a,textures[6]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x8c1a,0,0x8814,0x10,0x10,2,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,0,textures[0],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,1,textures[1],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,2,textures[2],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,3,textures[3],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,4,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])),0,'\0',
             0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,5,textures[5],0,'\x01',0,35000,0x8814);
  pvVar16 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(pCVar18,6,textures[6],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glClear(pCVar18,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar18,GVar9);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,0);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,1);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,2);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,3);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,4);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,5);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,6);
  glu::CallLogWrapper::glBindVertexArray(pCVar18,*local_1e0);
  iVar14 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar18,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar18,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_520->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar14,pvVar16);
  GVar15 = (GLenum)pvVar16;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  glu::CallLogWrapper::glGetProgramiv(pCVar18,GVar9,0x8b86,&uniforms);
  local_410 = pCVar18;
  if (uniforms == 7) {
LAB_009b1427:
    GVar13 = 0;
    do {
      pcVar17 = name;
      glu::CallLogWrapper::glGetActiveUniformName(local_410,GVar9,GVar13,0x20,(GLsizei *)0x0,name);
      GVar15 = (GLenum)pcVar17;
      local_518 = &local_508;
      sVar12 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,name,name + sVar12);
      local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
      local_550.first.field_2._M_allocated_capacity._0_4_ =
           (undefined4)local_508._M_allocated_capacity;
      local_550.first.field_2._M_local_buf[6] = (char)((ulong)local_508._0_8_ >> 0x30);
      local_550.first.field_2._M_local_buf[7] = (char)((ulong)local_508._0_8_ >> 0x38);
      local_550.first.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)local_508._0_8_ >> 0x20);
      if (local_518 == &local_508) {
        local_550.first.field_2._M_local_buf[9] = (char)local_508._9_7_;
        local_550.first.field_2._M_local_buf[10] = (char)((uint7)local_508._9_7_ >> 8);
        local_550.first.field_2._M_local_buf[0xb] = (char)((uint7)local_508._9_7_ >> 0x10);
        local_550.first.field_2._M_local_buf[0xc] = (char)((uint7)local_508._9_7_ >> 0x18);
        local_550.first.field_2._M_local_buf[0xd] = (char)((uint7)local_508._9_7_ >> 0x20);
        local_550.first.field_2._M_local_buf[0xe] = (char)((uint7)local_508._9_7_ >> 0x28);
        local_550.first.field_2._M_local_buf[0xf] = (char)((uint7)local_508._9_7_ >> 0x30);
      }
      else {
        local_550.first._M_dataplus._M_p = (pointer)local_518;
      }
      local_550.first._M_string_length = local_510;
      local_510 = 0;
      local_508._M_allocated_capacity = local_508._M_allocated_capacity & 0xffffffffffffff00;
      local_550.second = GVar13;
      local_518 = &local_508;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
        operator_delete(local_550.first._M_dataplus._M_p,
                        CONCAT17(local_550.first.field_2._M_local_buf[7],
                                 CONCAT16(local_550.first.field_2._M_local_buf[6],
                                          CONCAT24(local_550.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_550.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518,local_508._M_allocated_capacity + 1);
      }
      GVar13 = GVar13 + 1;
    } while (GVar13 < (uint)uniforms);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
    bVar3 = false;
    if (uniforms != 0) goto LAB_009b1427;
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '1';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x904c,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x904d,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '3';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar6 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x904e,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'r';
  local_550.first.field_2._M_local_buf[0xb] = 'e';
  local_550.first.field_2._M_local_buf[0xc] = 'c';
  local_550.first.field_2._M_local_buf[0xd] = 't';
  local_550.first._M_string_length = 0xe;
  local_550.first.field_2._M_local_buf[0xe] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar7 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x904f,GVar15);
  local_521 = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = 'b';
  local_550.first.field_2._M_local_buf[9] = 'u';
  local_550.first.field_2._M_local_buf[10] = 'f';
  local_550.first.field_2._M_local_buf[0xb] = 'f';
  local_550.first.field_2._M_local_buf[0xc] = 'e';
  local_550.first.field_2._M_local_buf[0xd] = 'r';
  local_550.first._M_string_length = 0xe;
  local_550.first.field_2._M_local_buf[0xe] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  local_522 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                         &name_index_map,0x9051,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '1';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'a';
  local_550.first.field_2._M_local_buf[0xb] = 'r';
  local_550.first.field_2._M_local_buf[0xc] = 'r';
  local_550.first.field_2._M_local_buf[0xd] = 'a';
  local_550.first.field_2._M_local_buf[0xe] = 'y';
  local_550.first._M_string_length = 0xf;
  local_550.first.field_2._M_local_buf[0xf] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9052,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'a';
  local_550.first.field_2._M_local_buf[0xb] = 'r';
  local_550.first.field_2._M_local_buf[0xc] = 'r';
  local_550.first.field_2._M_local_buf[0xd] = 'a';
  local_550.first.field_2._M_local_buf[0xe] = 'y';
  local_550.first._M_string_length = 0xf;
  local_550.first.field_2._M_local_buf[0xf] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar8 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9053,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  pCVar18 = local_410;
  glu::CallLogWrapper::glUseProgram(local_410,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar18,GVar9);
  glu::CallLogWrapper::glDeleteTextures(pCVar18,7,textures);
  glu::CallLogWrapper::glDeleteBuffers(pCVar18,1,&buffer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((bVar7 & local_522 & bVar4 & (bVar5 && bVar6) & bVar3 & local_521 & bVar8) != 1) {
    return -1;
  }
  local_1b8.m_data[0] = -NAN;
  local_1b8.m_data[1] = 1.4013e-44;
  local_1b8.m_data[2] = -NAN;
  local_1b8.m_data[3] = 4.2039e-42;
  local_428.m_data[0] = -NAN;
  local_428.m_data[1] = 1.4013e-44;
  local_428.m_data[2] = -NAN;
  local_428.m_data[3] = 4.2039e-42;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  pCVar18 = local_410;
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_550.first.field_2._M_local_buf[6] = 'i';
  local_550.first._M_string_length = 7;
  local_550.first.field_2._M_local_buf[7] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_550.first._M_dataplus._M_p,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[0x10] = 'i';
  name[0x11] = '\0';
  name[8] = '\x01';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)name._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image1D g_image_1d;\nlayout(",0x1b);
  local_518 = &local_508;
  local_510 = 7;
  local_508._M_allocated_capacity = 0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_518->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[4]._0_1_ = 0x69;
  textures[4]._1_1_ = 0;
  textures[2] = 1;
  textures[3] = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)textures._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image2D g_image_2d;\nlayout(",0x1b);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x7;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  _buffer = &local_498;
  local_498 = 'i';
  uStack_497 = 0;
  local_4a0 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,_buffer,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image3D g_image_3d;\nlayout(",0x1b);
  _uniforms = &local_438;
  local_440 = 7;
  local_438 = 0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)_uniforms,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_220 = &local_210;
  local_210 = 'i';
  uStack_20f = 0;
  local_218 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_220,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"image2DRect g_image_2drect;\nlayout(",0x23);
  local_3c0 = &local_3b0;
  local_3b8 = 7;
  local_3b0 = 0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3c0,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_240 = &local_230;
  local_230 = 'i';
  uStack_22f = 0;
  local_238 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_240,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"imageBuffer g_image_buffer;\nlayout(",0x23);
  local_3e0 = &local_3d0;
  local_3d8 = 7;
  local_3d0 = 0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3e0,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_260 = &local_250;
  local_250 = 'i';
  uStack_24f = 0;
  local_258 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_260,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_400 = &local_3f0;
  local_3f8 = 7;
  local_3f0 = 0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_400,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_280 = &local_270;
  local_270 = 'i';
  uStack_26f = 0;
  local_278 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x7c);
  local_2a0 = &local_290;
  local_290 = 'i';
  uStack_28f = 0;
  local_298 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2a0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ",0x39);
  local_2c0 = &local_2b0;
  local_2b0 = 'i';
  uStack_2af = 0;
  local_2b8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
             ,0x56);
  local_2e0 = &local_2d0;
  local_2d0 = 'i';
  uStack_2cf = 0;
  local_2d8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
             ,0x62);
  local_300 = &local_2f0;
  local_2f0 = 'i';
  uStack_2ef = 0;
  local_2f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_300,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
             ,99);
  local_320 = &local_310;
  local_310 = 'i';
  uStack_30f = 0;
  local_318 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_320,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
             ,0x59);
  local_340 = &local_330;
  local_330 = 'i';
  uStack_32f = 0;
  local_338 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_340,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
             ,0x5c);
  local_360 = &local_350;
  local_350 = 'i';
  uStack_34f = 0;
  local_358 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_360,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
             ,0x66);
  local_380 = &local_370;
  local_370 = 'i';
  uStack_36f = 0;
  local_378 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_380,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
             ,0x67);
  local_3a0 = &local_390;
  local_390 = 'i';
  uStack_38f = 0;
  local_398 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
             ,100);
  local_200 = &local_1f0;
  local_1f0 = 'i';
  uStack_1ef = 0;
  local_1f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_200,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
             ,0x65);
  local_1d8.m_data._0_8_ = &local_1c8;
  local_1c8 = 'i';
  uStack_1c7 = 0;
  local_1d8.m_data[2] = 1.4013e-45;
  local_1d8.m_data[3] = 0.0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_1d8.m_data._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}",0x27);
  if ((char *)local_1d8.m_data._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8.m_data._0_8_,
                    CONCAT62(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)) + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT62(uStack_38e,CONCAT11(uStack_38f,local_390)) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT62(uStack_36e,CONCAT11(uStack_36f,local_370)) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
  }
  if (_uniforms != &local_438) {
    operator_delete(_uniforms,local_438 + 1);
  }
  if (_buffer != &local_498) {
    operator_delete(_buffer,CONCAT62(uStack_496,CONCAT11(uStack_497,local_498)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var2 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar9 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_520->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_488.m_data._0_8_,(bool *)0x0
                    );
  if ((long *)local_488.m_data._0_8_ != local_478) {
    operator_delete((void *)local_488.m_data._0_8_,local_478[0] + 1);
  }
  glu::CallLogWrapper::glGenTextures(pCVar18,7,textures);
  glu::CallLogWrapper::glGenBuffers(pCVar18,1,&buffer);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data,0x200,
             (value_type *)&local_1b8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D
            (pCVar18,0xde0,0,0x8d82,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde0,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0xde1,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde1,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x806f,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x806f,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x84f5,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x84f5,0);
  glu::CallLogWrapper::glBindBuffer(pCVar18,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData
            (pCVar18,0x8c2a,0x100,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(pCVar18,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x8c2a,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])));
  glu::CallLogWrapper::glTexBuffer(pCVar18,0x8c2a,0x8d82,buffer);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c18,textures[5]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8c18,0,0x8d82,0x10,2,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c1a,textures[6]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x8c1a,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,0,textures[0],0,'\0',0,35000,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,1,textures[1],0,'\0',0,35000,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,2,textures[2],0,'\x01',0,35000,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,3,textures[3],0,'\0',0,35000,0x8d82);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,4,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])),0,'\0',
             0,35000,0x8d82);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,5,textures[5],0,'\x01',0,35000,0x8d82);
  pvVar16 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(pCVar18,6,textures[6],0,'\x01',0,35000,0x8d82);
  glu::CallLogWrapper::glClear(pCVar18,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar18,GVar9);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,0);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,1);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,2);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,3);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,4);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,5);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,6);
  glu::CallLogWrapper::glBindVertexArray(pCVar18,*local_1e0);
  iVar14 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar18,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar18,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_520->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar14,pvVar16);
  GVar15 = (GLenum)pvVar16;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  glu::CallLogWrapper::glGetProgramiv(pCVar18,GVar9,0x8b86,&uniforms);
  if (uniforms == 7) {
LAB_009b2cfa:
    GVar13 = 0;
    do {
      pcVar17 = name;
      glu::CallLogWrapper::glGetActiveUniformName(local_410,GVar9,GVar13,0x20,(GLsizei *)0x0,name);
      GVar15 = (GLenum)pcVar17;
      local_518 = &local_508;
      sVar12 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,name,name + sVar12);
      local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
      local_550.first.field_2._M_allocated_capacity._0_4_ =
           (undefined4)local_508._M_allocated_capacity;
      local_550.first.field_2._M_local_buf[6] = (char)((ulong)local_508._0_8_ >> 0x30);
      local_550.first.field_2._M_local_buf[7] = (char)((ulong)local_508._0_8_ >> 0x38);
      local_550.first.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)local_508._0_8_ >> 0x20);
      if (local_518 == &local_508) {
        local_550.first.field_2._M_local_buf[8] = local_508._M_local_buf[8];
        local_550.first.field_2._M_local_buf[9] = (char)local_508._9_7_;
        local_550.first.field_2._M_local_buf[10] = (char)((uint7)local_508._9_7_ >> 8);
        local_550.first.field_2._M_local_buf[0xb] = (char)((uint7)local_508._9_7_ >> 0x10);
        local_550.first.field_2._M_local_buf[0xc] = (char)((uint7)local_508._9_7_ >> 0x18);
        local_550.first.field_2._M_local_buf[0xd] = (char)((uint7)local_508._9_7_ >> 0x20);
        local_550.first.field_2._M_local_buf[0xe] = (char)((uint7)local_508._9_7_ >> 0x28);
        local_550.first.field_2._M_local_buf[0xf] = (char)((uint7)local_508._9_7_ >> 0x30);
      }
      else {
        local_550.first._M_dataplus._M_p = (pointer)local_518;
      }
      local_550.first._M_string_length = local_510;
      local_510 = 0;
      local_508._M_allocated_capacity = local_508._M_allocated_capacity & 0xffffffffffffff00;
      local_550.second = GVar13;
      local_518 = &local_508;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
        operator_delete(local_550.first._M_dataplus._M_p,
                        CONCAT17(local_550.first.field_2._M_local_buf[7],
                                 CONCAT16(local_550.first.field_2._M_local_buf[6],
                                          CONCAT24(local_550.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_550.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518,local_508._M_allocated_capacity + 1);
      }
      GVar13 = GVar13 + 1;
    } while (GVar13 < (uint)uniforms);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
    bVar3 = false;
    if (uniforms != 0) goto LAB_009b2cfa;
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '1';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9057,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9058,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '3';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar6 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9059,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'r';
  local_550.first.field_2._M_local_buf[0xb] = 'e';
  local_550.first.field_2._M_local_buf[0xc] = 'c';
  local_550.first.field_2._M_local_buf[0xd] = 't';
  local_550.first._M_string_length = 0xe;
  local_550.first.field_2._M_local_buf[0xe] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar7 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x905a,GVar15);
  local_521 = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = 'b';
  local_550.first.field_2._M_local_buf[9] = 'u';
  local_550.first.field_2._M_local_buf[10] = 'f';
  local_550.first.field_2._M_local_buf[0xb] = 'f';
  local_550.first.field_2._M_local_buf[0xc] = 'e';
  local_550.first.field_2._M_local_buf[0xd] = 'r';
  local_550.first._M_string_length = 0xe;
  local_550.first.field_2._M_local_buf[0xe] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  local_522 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                         &name_index_map,0x905c,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '1';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'a';
  local_550.first.field_2._M_local_buf[0xb] = 'r';
  local_550.first.field_2._M_local_buf[0xc] = 'r';
  local_550.first.field_2._M_local_buf[0xd] = 'a';
  local_550.first.field_2._M_local_buf[0xe] = 'y';
  local_550.first._M_string_length = 0xf;
  local_550.first.field_2._M_local_buf[0xf] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x905d,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'a';
  local_550.first.field_2._M_local_buf[0xb] = 'r';
  local_550.first.field_2._M_local_buf[0xc] = 'r';
  local_550.first.field_2._M_local_buf[0xd] = 'a';
  local_550.first.field_2._M_local_buf[0xe] = 'y';
  local_550.first._M_string_length = 0xf;
  local_550.first.field_2._M_local_buf[0xf] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar8 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x905e,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  pCVar18 = local_410;
  glu::CallLogWrapper::glUseProgram(local_410,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar18,GVar9);
  glu::CallLogWrapper::glDeleteTextures(pCVar18,7,textures);
  glu::CallLogWrapper::glDeleteBuffers(pCVar18,1,&buffer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((bVar7 & local_522 & bVar4 & (bVar5 && bVar6) & bVar3 & local_521 & bVar8) != 1) {
    return -1;
  }
  local_1b8.m_data[0] = 1.4013e-45;
  local_1b8.m_data[1] = 1.4013e-44;
  local_1b8.m_data[2] = 2.8026e-43;
  local_1b8.m_data[3] = 4.2039e-42;
  local_428.m_data[0] = 1.4013e-45;
  local_428.m_data[1] = 1.4013e-44;
  local_428.m_data[2] = 2.8026e-43;
  local_428.m_data[3] = 4.2039e-42;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  pCVar18 = local_410;
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_550.first.field_2._M_local_buf[6] = 'u';
  local_550.first.field_2._M_local_buf[7] = 'i';
  local_550.first._M_string_length = 8;
  local_550.first.field_2._M_local_buf[8] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_550.first._M_dataplus._M_p,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[0x10] = 'u';
  name[0x11] = '\0';
  name[8] = '\x01';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)name._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image1D g_image_1d;\nlayout(",0x1b);
  local_518 = &local_508;
  local_508._M_allocated_capacity = 0x6975323361626772;
  local_510 = 8;
  local_508._M_local_buf[8] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_518->_M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[4]._0_1_ = 0x75;
  textures[4]._1_1_ = 0;
  textures[2] = 1;
  textures[3] = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)textures._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image2D g_image_2d;\nlayout(",0x1b);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x6975323361626772;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x8;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  _buffer = &local_498;
  local_498 = 'u';
  uStack_497 = 0;
  local_4a0 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,_buffer,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"image3D g_image_3d;\nlayout(",0x1b);
  _uniforms = &local_438;
  local_438 = 0x6975323361626772;
  local_440 = 8;
  local_430 = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)_uniforms,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_220 = &local_210;
  local_210 = 'u';
  uStack_20f = 0;
  local_218 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_220,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"image2DRect g_image_2drect;\nlayout(",0x23);
  local_3c0 = &local_3b0;
  local_3b0 = 0x6975323361626772;
  local_3b8 = 8;
  local_3a8 = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3c0,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_240 = &local_230;
  local_230 = 'u';
  uStack_22f = 0;
  local_238 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_240,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"imageBuffer g_image_buffer;\nlayout(",0x23);
  local_3e0 = &local_3d0;
  local_3d0 = 0x6975323361626772;
  local_3d8 = 8;
  local_3c8 = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3e0,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_260 = &local_250;
  local_250 = 'u';
  uStack_24f = 0;
  local_258 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_260,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_400 = &local_3f0;
  local_3f0 = 0x6975323361626772;
  local_3f8 = 8;
  local_3e8 = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_400,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  local_280 = &local_270;
  local_270 = 'u';
  uStack_26f = 0;
  local_278 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x7c);
  local_2a0 = &local_290;
  local_290 = 'u';
  uStack_28f = 0;
  local_298 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2a0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ",0x39);
  local_2c0 = &local_2b0;
  local_2b0 = 'u';
  uStack_2af = 0;
  local_2b8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
             ,0x56);
  local_2e0 = &local_2d0;
  local_2d0 = 'u';
  uStack_2cf = 0;
  local_2d8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
             ,0x62);
  local_300 = &local_2f0;
  local_2f0 = 'u';
  uStack_2ef = 0;
  local_2f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_300,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
             ,99);
  local_320 = &local_310;
  local_310 = 'u';
  uStack_30f = 0;
  local_318 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_320,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
             ,0x59);
  local_340 = &local_330;
  local_330 = 'u';
  uStack_32f = 0;
  local_338 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_340,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
             ,0x5c);
  local_360 = &local_350;
  local_350 = 'u';
  uStack_34f = 0;
  local_358 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_360,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
             ,0x66);
  local_380 = &local_370;
  local_370 = 'u';
  uStack_36f = 0;
  local_378 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_380,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
             ,0x67);
  local_3a0 = &local_390;
  local_390 = 'u';
  uStack_38f = 0;
  local_398 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
             ,100);
  local_200 = &local_1f0;
  local_1f0 = 'u';
  uStack_1ef = 0;
  local_1f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_200,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
             ,0x65);
  local_1d8.m_data._0_8_ = &local_1c8;
  local_1c8 = 'u';
  uStack_1c7 = 0;
  local_1d8.m_data[2] = 1.4013e-45;
  local_1d8.m_data[3] = 0.0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_1d8.m_data._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}",0x27);
  if ((char *)local_1d8.m_data._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8.m_data._0_8_,
                    CONCAT62(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)) + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT62(uStack_38e,CONCAT11(uStack_38f,local_390)) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT62(uStack_36e,CONCAT11(uStack_36f,local_370)) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
  }
  if (_uniforms != &local_438) {
    operator_delete(_uniforms,local_438 + 1);
  }
  if (_buffer != &local_498) {
    operator_delete(_buffer,CONCAT62(uStack_496,CONCAT11(uStack_497,local_498)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var2 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar9 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_520->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_488.m_data._0_8_,(bool *)0x0
                    );
  if ((long *)local_488.m_data._0_8_ != local_478) {
    operator_delete((void *)local_488.m_data._0_8_,local_478[0] + 1);
  }
  glu::CallLogWrapper::glGenTextures(pCVar18,7,textures);
  glu::CallLogWrapper::glGenBuffers(pCVar18,1,&buffer);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&data,0x200,(value_type *)&local_1b8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D
            (pCVar18,0xde0,0,0x8d70,0x10,0,0x8d99,0x1405,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde0,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0xde1,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0xde1,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x806f,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x806f,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x84f5,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x84f5,0);
  glu::CallLogWrapper::glBindBuffer(pCVar18,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData
            (pCVar18,0x8c2a,0x100,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(pCVar18,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x8c2a,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])));
  glu::CallLogWrapper::glTexBuffer(pCVar18,0x8c2a,0x8d70,buffer);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c18,textures[5]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8c18,0,0x8d70,0x10,2,0,0x8d99,0x1405,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c1a,textures[6]);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x8c1a,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,0,textures[0],0,'\0',0,35000,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,1,textures[1],0,'\0',0,35000,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,2,textures[2],0,'\x01',0,35000,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,3,textures[3],0,'\0',0,35000,0x8d70);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,4,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])),0,'\0',
             0,35000,0x8d70);
  glu::CallLogWrapper::glBindImageTexture(pCVar18,5,textures[5],0,'\x01',0,35000,0x8d70);
  pvVar16 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(pCVar18,6,textures[6],0,'\x01',0,35000,0x8d70);
  glu::CallLogWrapper::glClear(pCVar18,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar18,GVar9);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,0);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,1);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,2);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,3);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,4);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,5);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,6);
  glu::CallLogWrapper::glBindVertexArray(pCVar18,*local_1e0);
  iVar14 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar18,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar18,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_520->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar14,pvVar16);
  GVar15 = (GLenum)pvVar16;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  glu::CallLogWrapper::glGetProgramiv(pCVar18,GVar9,0x8b86,&uniforms);
  if (uniforms == 7) {
LAB_009b4574:
    GVar13 = 0;
    do {
      pcVar17 = name;
      glu::CallLogWrapper::glGetActiveUniformName(local_410,GVar9,GVar13,0x20,(GLsizei *)0x0,name);
      GVar15 = (GLenum)pcVar17;
      local_518 = &local_508;
      sVar12 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,name,name + sVar12);
      local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
      local_550.first.field_2._M_allocated_capacity._0_4_ =
           (undefined4)local_508._M_allocated_capacity;
      local_550.first.field_2._M_local_buf[6] = (char)((ulong)local_508._0_8_ >> 0x30);
      local_550.first.field_2._M_local_buf[7] = (char)((ulong)local_508._0_8_ >> 0x38);
      local_550.first.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)local_508._0_8_ >> 0x20);
      if (local_518 == &local_508) {
        local_550.first.field_2._M_local_buf[8] = local_508._M_local_buf[8];
        local_550.first.field_2._M_local_buf[9] = (char)local_508._9_7_;
        local_550.first.field_2._M_local_buf[10] = (char)((uint7)local_508._9_7_ >> 8);
        local_550.first.field_2._M_local_buf[0xb] = (char)((uint7)local_508._9_7_ >> 0x10);
        local_550.first.field_2._M_local_buf[0xc] = (char)((uint7)local_508._9_7_ >> 0x18);
        local_550.first.field_2._M_local_buf[0xd] = (char)((uint7)local_508._9_7_ >> 0x20);
        local_550.first.field_2._M_local_buf[0xe] = (char)((uint7)local_508._9_7_ >> 0x28);
        local_550.first.field_2._M_local_buf[0xf] = (char)((uint7)local_508._9_7_ >> 0x30);
      }
      else {
        local_550.first._M_dataplus._M_p = (pointer)local_518;
      }
      local_550.first._M_string_length = local_510;
      local_510 = 0;
      local_508._M_allocated_capacity = local_508._M_allocated_capacity & 0xffffffffffffff00;
      local_550.second = GVar13;
      local_518 = &local_508;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
        operator_delete(local_550.first._M_dataplus._M_p,
                        CONCAT17(local_550.first.field_2._M_local_buf[7],
                                 CONCAT16(local_550.first.field_2._M_local_buf[6],
                                          CONCAT24(local_550.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_550.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518,local_508._M_allocated_capacity + 1);
      }
      GVar13 = GVar13 + 1;
    } while (GVar13 < (uint)uniforms);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
    bVar3 = false;
    if (uniforms != 0) goto LAB_009b4574;
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '1';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9062,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9063,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '3';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first._M_string_length = 10;
  local_550.first.field_2._M_local_buf[10] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar6 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9064,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'r';
  local_550.first.field_2._M_local_buf[0xb] = 'e';
  local_550.first.field_2._M_local_buf[0xc] = 'c';
  local_550.first.field_2._M_local_buf[0xd] = 't';
  local_550.first._M_string_length = 0xe;
  local_550.first.field_2._M_local_buf[0xe] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar7 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9065,GVar15);
  local_521 = bVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = 'b';
  local_550.first.field_2._M_local_buf[9] = 'u';
  local_550.first.field_2._M_local_buf[10] = 'f';
  local_550.first.field_2._M_local_buf[0xb] = 'f';
  local_550.first.field_2._M_local_buf[0xc] = 'e';
  local_550.first.field_2._M_local_buf[0xd] = 'r';
  local_550.first._M_string_length = 0xe;
  local_550.first.field_2._M_local_buf[0xe] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  local_522 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                         &name_index_map,0x9067,GVar15);
  local_401 = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '1';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'a';
  local_550.first.field_2._M_local_buf[0xb] = 'r';
  local_550.first.field_2._M_local_buf[0xc] = 'r';
  local_550.first.field_2._M_local_buf[0xd] = 'a';
  local_550.first.field_2._M_local_buf[0xe] = 'y';
  local_550.first._M_string_length = 0xf;
  local_550.first.field_2._M_local_buf[0xf] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9068,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = '2';
  local_550.first.field_2._M_local_buf[9] = 'd';
  local_550.first.field_2._M_local_buf[10] = 'a';
  local_550.first.field_2._M_local_buf[0xb] = 'r';
  local_550.first.field_2._M_local_buf[0xc] = 'r';
  local_550.first.field_2._M_local_buf[0xd] = 'a';
  local_550.first.field_2._M_local_buf[0xe] = 'y';
  local_550.first._M_string_length = 0xf;
  local_550.first.field_2._M_local_buf[0xf] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar6 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9069,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  pCVar18 = local_410;
  glu::CallLogWrapper::glUseProgram(local_410,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar18,GVar9);
  glu::CallLogWrapper::glDeleteTextures(pCVar18,7,textures);
  glu::CallLogWrapper::glDeleteBuffers(pCVar18,1,&buffer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((bVar7 & local_522 & bVar4 & bVar5 & local_521 & bVar3 & local_401 & bVar6) != 1) {
    return -1;
  }
  local_1d8.m_data[0] = -1.0;
  local_1d8.m_data[1] = 10.0;
  local_1d8.m_data[2] = -200.0;
  local_1d8.m_data[3] = 3000.0;
  local_488.m_data[0] = -1.0;
  local_488.m_data[1] = 10.0;
  local_488.m_data[2] = -200.0;
  local_488.m_data[3] = 3000.0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  pCVar18 = local_410;
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_550.first.field_2._M_local_buf[6] = 'f';
  local_550.first._M_string_length = 7;
  local_550.first.field_2._M_local_buf[7] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_550.first._M_dataplus._M_p,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)name._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"imageCube g_image_cube;\nlayout(",0x1f);
  local_518 = &local_508;
  local_510 = 7;
  local_508._M_allocated_capacity = 0x66323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_518->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[2] = 0;
  textures[3] = 0;
  textures[4]._0_1_ = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)textures._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x81);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ",0x43);
  _buffer = &local_498;
  local_4a0 = 0;
  local_498 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,_buffer,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
             ,0x61);
  _uniforms = &local_438;
  local_440 = 0;
  local_438 = local_438 & 0xffffffffffffff00;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)_uniforms,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
             ,0x62);
  local_220 = &local_210;
  local_218 = 0;
  local_210 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_220,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
             ,0x61);
  local_3c0 = &local_3b0;
  local_3b8 = 0;
  local_3b0 = local_3b0 & 0xffffffffffffff00;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3c0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
             ,0x62);
  local_240 = &local_230;
  local_238 = 0;
  local_230 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_240,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
             ,0x61);
  local_3e0 = &local_3d0;
  local_3d8 = 0;
  local_3d0 = local_3d0 & 0xffffffffffffff00;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3e0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
             ,0x68);
  local_260 = &local_250;
  local_258 = 0;
  local_250 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_260,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
             ,0x68);
  local_400 = &local_3f0;
  local_3f8 = 0;
  local_3f0 = local_3f0 & 0xffffffffffffff00;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_400,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
             ,0x67);
  local_280 = &local_270;
  local_278 = 0;
  local_270 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_280,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
             ,0x68);
  local_2a0 = &local_290;
  local_298 = 0;
  local_290 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2a0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
             ,0x67);
  local_2c0 = &local_2b0;
  local_2b8 = 0;
  local_2b0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2c0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
             ,0x68);
  local_2e0 = &local_2d0;
  local_2d8 = 0;
  local_2d0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2e0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
             ,0x67);
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_300,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
             ,0x68);
  local_320 = &local_310;
  local_318 = 0;
  local_310 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_320,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
             ,0x67);
  local_340 = &local_330;
  local_338 = 0;
  local_330 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_340,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
             ,0x68);
  local_360 = &local_350;
  local_358 = 0;
  local_350 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_360,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
             ,0x68);
  local_380 = &local_370;
  local_378 = 0;
  local_370 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_380,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
             ,0x69);
  local_3a0 = &local_390;
  local_398 = 0;
  local_390 = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}",0x27);
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT62(uStack_38e,CONCAT11(uStack_38f,local_390)) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT62(uStack_36e,CONCAT11(uStack_36f,local_370)) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
  }
  if (_uniforms != &local_438) {
    operator_delete(_uniforms,local_438 + 1);
  }
  if (_buffer != &local_498) {
    operator_delete(_buffer,CONCAT62(uStack_496,CONCAT11(uStack_497,local_498)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var2 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar9 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_520->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,local_200,(bool *)0x0);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  glu::CallLogWrapper::glGenTextures(pCVar18,2,(GLuint *)&data);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)textures,
             0xc00,&local_1d8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x8513,
             (GLuint)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8516,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8515,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8518,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8517,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x851a,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8519,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8513,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x9009,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x9009,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x9009,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x9009,0,0x8814,0x10,0x10,0xc,0,0x1908,0x1406,(void *)textures._0_8_);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x9009,0);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,0,
             (GLuint)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,0x8814);
  pvVar16 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,1,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glClear(pCVar18,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar18,GVar9);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,0);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,1);
  glu::CallLogWrapper::glBindVertexArray(pCVar18,*local_1e0);
  iVar14 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar18,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar18,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_520->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar14,pvVar16);
  GVar15 = (GLenum)pvVar16;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  glu::CallLogWrapper::glGetProgramiv(pCVar18,GVar9,0x8b86,(GLint *)&buffer);
  if (buffer == 2) {
LAB_009b5ac9:
    GVar13 = 0;
    do {
      pcVar17 = name;
      glu::CallLogWrapper::glGetActiveUniformName(local_410,GVar9,GVar13,0x20,(GLsizei *)0x0,name);
      GVar15 = (GLenum)pcVar17;
      local_518 = &local_508;
      sVar12 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,name,name + sVar12);
      local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
      local_550.first.field_2._M_allocated_capacity._0_4_ =
           (undefined4)local_508._M_allocated_capacity;
      local_550.first.field_2._M_local_buf[6] = (char)((ulong)local_508._0_8_ >> 0x30);
      local_550.first.field_2._M_local_buf[7] = (char)((ulong)local_508._0_8_ >> 0x38);
      local_550.first.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)local_508._0_8_ >> 0x20);
      if (local_518 == &local_508) {
        local_550.first.field_2._M_local_buf[8] = local_508._M_local_buf[8];
        local_550.first.field_2._M_local_buf[9] = (char)local_508._9_7_;
        local_550.first.field_2._M_local_buf[10] = (char)((uint7)local_508._9_7_ >> 8);
        local_550.first.field_2._M_local_buf[0xb] = (char)((uint7)local_508._9_7_ >> 0x10);
        local_550.first.field_2._M_local_buf[0xc] = (char)((uint7)local_508._9_7_ >> 0x18);
        local_550.first.field_2._M_local_buf[0xd] = (char)((uint7)local_508._9_7_ >> 0x20);
        local_550.first.field_2._M_local_buf[0xe] = (char)((uint7)local_508._9_7_ >> 0x28);
        local_550.first.field_2._M_local_buf[0xf] = (char)((uint7)local_508._9_7_ >> 0x30);
      }
      else {
        local_550.first._M_dataplus._M_p = (pointer)local_518;
      }
      local_550.first._M_string_length = local_510;
      local_510 = 0;
      local_508._M_allocated_capacity = local_508._M_allocated_capacity & 0xffffffffffffff00;
      local_550.second = GVar13;
      local_518 = &local_508;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
        operator_delete(local_550.first._M_dataplus._M_p,
                        CONCAT17(local_550.first.field_2._M_local_buf[7],
                                 CONCAT16(local_550.first.field_2._M_local_buf[6],
                                          CONCAT24(local_550.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_550.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518,local_508._M_allocated_capacity + 1);
      }
      GVar13 = GVar13 + 1;
      pCVar18 = local_410;
    } while (GVar13 < buffer);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    bVar3 = false;
    if (buffer != 0) goto LAB_009b5ac9;
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = 'c';
  local_550.first.field_2._M_local_buf[9] = 'u';
  local_550.first.field_2._M_local_buf[10] = 'b';
  local_550.first.field_2._M_local_buf[0xb] = 'e';
  local_550.first._M_string_length = 0xc;
  local_550.first.field_2._M_local_buf[0xc] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9050,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  name[0] = '\x12';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_550.first._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)name);
  local_550.first.field_2._M_allocated_capacity._0_4_ = (undefined4)name._0_8_;
  local_550.first.field_2._M_allocated_capacity._4_2_ = SUB82(name._0_8_,4);
  local_550.first.field_2._M_local_buf[6] = SUB81(name._0_8_,6);
  local_550.first.field_2._M_local_buf[7] = SUB81(name._0_8_,7);
  builtin_strncpy(local_550.first._M_dataplus._M_p,"g_image_cube_array",0x12);
  local_550.first._M_string_length._0_1_ = name[0];
  local_550.first._M_string_length._1_1_ = name[1];
  local_550.first._M_string_length._2_1_ = name[2];
  local_550.first._M_string_length._3_1_ = name[3];
  local_550.first._M_string_length._4_1_ = name[4];
  local_550.first._M_string_length._5_1_ = name[5];
  local_550.first._M_string_length._6_1_ = name[6];
  local_550.first._M_string_length._7_1_ = name[7];
  local_550.first._M_dataplus._M_p[name._0_8_] = '\0';
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9054,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  glu::CallLogWrapper::glUseProgram(pCVar18,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar18,GVar9);
  glu::CallLogWrapper::glDeleteTextures(pCVar18,2,(GLuint *)&data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (textures._0_8_ != 0) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) -
                    textures._0_8_);
  }
  if ((bVar3 & bVar4 & bVar5) != 1) {
    return -1;
  }
  local_1d8.m_data[0] = -NAN;
  local_1d8.m_data[1] = 1.4013e-44;
  local_1d8.m_data[2] = -NAN;
  local_1d8.m_data[3] = 4.2039e-42;
  local_488.m_data[0] = -NAN;
  local_488.m_data[1] = 1.4013e-44;
  local_488.m_data[2] = -NAN;
  local_488.m_data[3] = 4.2039e-42;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_550.first.field_2._M_local_buf[6] = 'i';
  local_550.first._M_string_length = 7;
  local_550.first.field_2._M_local_buf[7] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_550.first._M_dataplus._M_p,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[0x10] = 'i';
  name[0x11] = '\0';
  name[8] = '\x01';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)name._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"imageCube g_image_cube;\nlayout(",0x1f);
  local_518 = &local_508;
  local_510 = 7;
  local_508._M_allocated_capacity = 0x69323361626772;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_518->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[4]._0_1_ = 0x69;
  textures[4]._1_1_ = 0;
  textures[2] = 1;
  textures[3] = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)textures._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x81);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT62(data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,0x69);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ",0x43);
  _buffer = &local_498;
  local_498 = 'i';
  uStack_497 = 0;
  local_4a0 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,_buffer,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
             ,0x61);
  _uniforms = &local_438;
  local_438 = CONCAT62(local_438._2_6_,0x69);
  local_440 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)_uniforms,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
             ,0x62);
  local_220 = &local_210;
  local_210 = 'i';
  uStack_20f = 0;
  local_218 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_220,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
             ,0x61);
  local_3c0 = &local_3b0;
  local_3b0 = CONCAT62(local_3b0._2_6_,0x69);
  local_3b8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
             ,0x62);
  local_240 = &local_230;
  local_230 = 'i';
  uStack_22f = 0;
  local_238 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_240,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
             ,0x61);
  local_3e0 = &local_3d0;
  local_3d0 = CONCAT62(local_3d0._2_6_,0x69);
  local_3d8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
             ,0x68);
  local_260 = &local_250;
  local_250 = 'i';
  uStack_24f = 0;
  local_258 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_260,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
             ,0x68);
  local_400 = &local_3f0;
  local_3f0 = CONCAT62(local_3f0._2_6_,0x69);
  local_3f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_400,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
             ,0x67);
  local_280 = &local_270;
  local_270 = 'i';
  uStack_26f = 0;
  local_278 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
             ,0x68);
  local_2a0 = &local_290;
  local_290 = 'i';
  uStack_28f = 0;
  local_298 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
             ,0x67);
  local_2c0 = &local_2b0;
  local_2b0 = 'i';
  uStack_2af = 0;
  local_2b8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
             ,0x68);
  local_2e0 = &local_2d0;
  local_2d0 = 'i';
  uStack_2cf = 0;
  local_2d8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
             ,0x67);
  local_300 = &local_2f0;
  local_2f0 = 'i';
  uStack_2ef = 0;
  local_2f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_300,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
             ,0x68);
  local_320 = &local_310;
  local_310 = 'i';
  uStack_30f = 0;
  local_318 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_320,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
             ,0x67);
  local_340 = &local_330;
  local_330 = 'i';
  uStack_32f = 0;
  local_338 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_340,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
             ,0x68);
  local_360 = &local_350;
  local_350 = 'i';
  uStack_34f = 0;
  local_358 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_360,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
             ,0x68);
  local_380 = &local_370;
  local_370 = 'i';
  uStack_36f = 0;
  local_378 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_380,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
             ,0x69);
  local_3a0 = &local_390;
  local_390 = 'i';
  uStack_38f = 0;
  local_398 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}",0x27);
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT62(uStack_38e,CONCAT11(uStack_38f,local_390)) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT62(uStack_36e,CONCAT11(uStack_36f,local_370)) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
  }
  if (_uniforms != &local_438) {
    operator_delete(_uniforms,local_438 + 1);
  }
  if (_buffer != &local_498) {
    operator_delete(_buffer,CONCAT62(uStack_496,CONCAT11(uStack_497,local_498)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var2 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar9 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_520->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,local_200,(bool *)0x0);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  glu::CallLogWrapper::glGenTextures(pCVar18,2,(GLuint *)&data);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)textures,0xc00,
             (value_type *)&local_1d8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x8513,
             (GLuint)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8516,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8515,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8518,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8517,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x851a,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8519,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8513,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x9009,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x9009,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x9009,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x9009,0,0x8d82,0x10,0x10,0xc,0,0x8d99,0x1404,(void *)textures._0_8_);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x9009,0);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,0,
             (GLuint)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,0x8d82);
  pvVar16 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,1,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8d82);
  glu::CallLogWrapper::glClear(pCVar18,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar18,GVar9);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,0);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,1);
  glu::CallLogWrapper::glBindVertexArray(pCVar18,*local_1e0);
  iVar14 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar18,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar18,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_520->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar14,pvVar16);
  GVar15 = (GLenum)pvVar16;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  glu::CallLogWrapper::glGetProgramiv(pCVar18,GVar9,0x8b86,(GLint *)&buffer);
  if (buffer == 2) {
LAB_009b6e68:
    GVar13 = 0;
    do {
      pcVar17 = name;
      glu::CallLogWrapper::glGetActiveUniformName(local_410,GVar9,GVar13,0x20,(GLsizei *)0x0,name);
      GVar15 = (GLenum)pcVar17;
      local_518 = &local_508;
      sVar12 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,name,name + sVar12);
      local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
      local_550.first.field_2._M_allocated_capacity._0_4_ =
           (undefined4)local_508._M_allocated_capacity;
      local_550.first.field_2._M_local_buf[6] = (char)((ulong)local_508._0_8_ >> 0x30);
      local_550.first.field_2._M_local_buf[7] = (char)((ulong)local_508._0_8_ >> 0x38);
      local_550.first.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)local_508._0_8_ >> 0x20);
      if (local_518 == &local_508) {
        local_550.first.field_2._M_local_buf[8] = local_508._M_local_buf[8];
        local_550.first.field_2._M_local_buf[9] = (char)local_508._9_7_;
        local_550.first.field_2._M_local_buf[10] = (char)((uint7)local_508._9_7_ >> 8);
        local_550.first.field_2._M_local_buf[0xb] = (char)((uint7)local_508._9_7_ >> 0x10);
        local_550.first.field_2._M_local_buf[0xc] = (char)((uint7)local_508._9_7_ >> 0x18);
        local_550.first.field_2._M_local_buf[0xd] = (char)((uint7)local_508._9_7_ >> 0x20);
        local_550.first.field_2._M_local_buf[0xe] = (char)((uint7)local_508._9_7_ >> 0x28);
        local_550.first.field_2._M_local_buf[0xf] = (char)((uint7)local_508._9_7_ >> 0x30);
      }
      else {
        local_550.first._M_dataplus._M_p = (pointer)local_518;
      }
      local_550.first._M_string_length = local_510;
      local_510 = 0;
      local_508._M_allocated_capacity = local_508._M_allocated_capacity & 0xffffffffffffff00;
      local_550.second = GVar13;
      local_518 = &local_508;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
        operator_delete(local_550.first._M_dataplus._M_p,
                        CONCAT17(local_550.first.field_2._M_local_buf[7],
                                 CONCAT16(local_550.first.field_2._M_local_buf[6],
                                          CONCAT24(local_550.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_550.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518,local_508._M_allocated_capacity + 1);
      }
      GVar13 = GVar13 + 1;
      pCVar18 = local_410;
    } while (GVar13 < buffer);
  }
  else {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    bVar3 = false;
    if (buffer != 0) goto LAB_009b6e68;
  }
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = 'c';
  local_550.first.field_2._M_local_buf[9] = 'u';
  local_550.first.field_2._M_local_buf[10] = 'b';
  local_550.first.field_2._M_local_buf[0xb] = 'e';
  local_550.first._M_string_length = 0xc;
  local_550.first.field_2._M_local_buf[0xc] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x905b,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  name[0] = '\x12';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_550.first._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)name);
  local_550.first.field_2._M_allocated_capacity._0_4_ = (undefined4)name._0_8_;
  local_550.first.field_2._M_allocated_capacity._4_2_ = SUB82(name._0_8_,4);
  local_550.first.field_2._M_local_buf[6] = SUB81(name._0_8_,6);
  local_550.first.field_2._M_local_buf[7] = SUB81(name._0_8_,7);
  builtin_strncpy(local_550.first._M_dataplus._M_p,"g_image_cube_array",0x12);
  local_550.first._M_string_length._0_1_ = name[0];
  local_550.first._M_string_length._1_1_ = name[1];
  local_550.first._M_string_length._2_1_ = name[2];
  local_550.first._M_string_length._3_1_ = name[3];
  local_550.first._M_string_length._4_1_ = name[4];
  local_550.first._M_string_length._5_1_ = name[5];
  local_550.first._M_string_length._6_1_ = name[6];
  local_550.first._M_string_length._7_1_ = name[7];
  local_550.first._M_dataplus._M_p[name._0_8_] = '\0';
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x905f,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  glu::CallLogWrapper::glUseProgram(pCVar18,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar18,GVar9);
  glu::CallLogWrapper::glDeleteTextures(pCVar18,2,(GLuint *)&data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (textures._0_8_ != 0) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) -
                    textures._0_8_);
  }
  if ((bVar3 & bVar4 & bVar5) != 1) {
    return -1;
  }
  local_1d8.m_data[0] = 1.4013e-45;
  local_1d8.m_data[1] = 1.4013e-44;
  local_1d8.m_data[2] = 2.8026e-43;
  local_1d8.m_data[3] = 4.2039e-42;
  local_488.m_data[0] = 1.4013e-45;
  local_488.m_data[1] = 1.4013e-44;
  local_488.m_data[2] = 2.8026e-43;
  local_488.m_data[3] = 4.2039e-42;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_550.first.field_2._M_local_buf[6] = 'u';
  local_550.first.field_2._M_local_buf[7] = 'i';
  local_550.first._M_string_length = 8;
  local_550.first.field_2._M_local_buf[8] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_550.first._M_dataplus._M_p,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[0x10] = 'u';
  name[0x11] = '\0';
  name[8] = '\x01';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)name._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"imageCube g_image_cube;\nlayout(",0x1f);
  local_518 = &local_508;
  local_508._M_allocated_capacity = 0x6975323361626772;
  local_510 = 8;
  local_508._M_local_buf[8] = '\0';
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_518->_M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[4]._0_1_ = 0x75;
  textures[4]._1_1_ = 0;
  textures[2] = 1;
  textures[3] = 0;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)textures._0_8_,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x81);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT62(data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,0x75);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ",0x43);
  _buffer = &local_498;
  local_498 = 'u';
  uStack_497 = 0;
  local_4a0 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,_buffer,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
             ,0x61);
  _uniforms = &local_438;
  local_438 = CONCAT62(local_438._2_6_,0x75);
  local_440 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)_uniforms,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
             ,0x62);
  local_220 = &local_210;
  local_210 = 'u';
  uStack_20f = 0;
  local_218 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_220,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
             ,0x61);
  local_3c0 = &local_3b0;
  local_3b0 = CONCAT62(local_3b0._2_6_,0x75);
  local_3b8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
             ,0x62);
  local_240 = &local_230;
  local_230 = 'u';
  uStack_22f = 0;
  local_238 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_240,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
             ,0x61);
  local_3e0 = &local_3d0;
  local_3d0 = CONCAT62(local_3d0._2_6_,0x75);
  local_3d8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_3e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
             ,0x68);
  local_260 = &local_250;
  local_250 = 'u';
  uStack_24f = 0;
  local_258 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_260,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
             ,0x68);
  local_400 = &local_3f0;
  local_3f0 = CONCAT62(local_3f0._2_6_,0x75);
  local_3f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_400,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
             ,0x67);
  local_280 = &local_270;
  local_270 = 'u';
  uStack_26f = 0;
  local_278 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
             ,0x68);
  local_2a0 = &local_290;
  local_290 = 'u';
  uStack_28f = 0;
  local_298 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
             ,0x67);
  local_2c0 = &local_2b0;
  local_2b0 = 'u';
  uStack_2af = 0;
  local_2b8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2c0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
             ,0x68);
  local_2e0 = &local_2d0;
  local_2d0 = 'u';
  uStack_2cf = 0;
  local_2d8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_2e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
             ,0x67);
  local_300 = &local_2f0;
  local_2f0 = 'u';
  uStack_2ef = 0;
  local_2f8 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_300,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
             ,0x68);
  local_320 = &local_310;
  local_310 = 'u';
  uStack_30f = 0;
  local_318 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_320,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
             ,0x67);
  local_340 = &local_330;
  local_330 = 'u';
  uStack_32f = 0;
  local_338 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_340,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
             ,0x68);
  local_360 = &local_350;
  local_350 = 'u';
  uStack_34f = 0;
  local_358 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_360,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
             ,0x68);
  local_380 = &local_370;
  local_370 = 'u';
  uStack_36f = 0;
  local_378 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_380,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
             ,0x69);
  local_3a0 = &local_390;
  local_390 = 'u';
  uStack_38f = 0;
  local_398 = 1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_3a0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"vec4",4);
  poVar11 = tcu::operator<<(poVar11,(Vector<unsigned_int,_4> *)&local_488);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}",0x27);
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT62(uStack_38e,CONCAT11(uStack_38f,local_390)) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT62(uStack_36e,CONCAT11(uStack_36f,local_370)) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
  }
  if (_uniforms != &local_438) {
    operator_delete(_uniforms,local_438 + 1);
  }
  if (_buffer != &local_498) {
    operator_delete(_buffer,CONCAT62(uStack_496,CONCAT11(uStack_497,local_498)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var2 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar9 = ShaderImageLoadStoreBase::BuildProgram
                    (&local_520->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,local_200,(bool *)0x0);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  glu::CallLogWrapper::glGenTextures(pCVar18,2,(GLuint *)&data);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )textures,0xc00,(value_type *)&local_1d8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x8513,
             (GLuint)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8516,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8515,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8518,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8517,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x851a,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glTexImage2D
            (pCVar18,0x8519,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x8513,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar18,0x9009,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x9009,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar18,0x9009,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar18,0x9009,0,0x8d70,0x10,0x10,0xc,0,0x8d99,0x1405,(void *)textures._0_8_);
  glu::CallLogWrapper::glBindTexture(pCVar18,0x9009,0);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,0,
             (GLuint)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,0x8d70);
  pvVar16 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture
            (pCVar18,1,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8d70);
  glu::CallLogWrapper::glClear(pCVar18,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar18,GVar9);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,0);
  GVar10 = glu::CallLogWrapper::glGetUniformLocation(pCVar18,GVar9,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i(pCVar18,GVar10,1);
  glu::CallLogWrapper::glBindVertexArray(pCVar18,*local_1e0);
  iVar14 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar18,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar18,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_520->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar14,pvVar16);
  GVar15 = (GLenum)pvVar16;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_1e0._0_4_ = (int)CONCAT71(extraout_var,bVar3);
  glu::CallLogWrapper::glGetProgramiv(pCVar18,GVar9,0x8b86,(GLint *)&buffer);
  if (buffer != 2) {
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    local_1e0._0_4_ = 0;
    if (buffer == 0) goto LAB_009b8302;
  }
  GVar13 = 0;
  do {
    pcVar17 = name;
    glu::CallLogWrapper::glGetActiveUniformName(local_410,GVar9,GVar13,0x20,(GLsizei *)0x0,name);
    GVar15 = (GLenum)pcVar17;
    local_518 = &local_508;
    sVar12 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,name,name + sVar12);
    local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
    local_550.first.field_2._M_allocated_capacity._0_4_ =
         (undefined4)local_508._M_allocated_capacity;
    local_550.first.field_2._M_local_buf[6] = (char)((ulong)local_508._0_8_ >> 0x30);
    local_550.first.field_2._M_local_buf[7] = (char)((ulong)local_508._0_8_ >> 0x38);
    local_550.first.field_2._M_allocated_capacity._4_2_ =
         (undefined2)((ulong)local_508._0_8_ >> 0x20);
    if (local_518 == &local_508) {
      local_550.first.field_2._M_local_buf[8] = local_508._M_local_buf[8];
      local_550.first.field_2._M_local_buf[9] = (char)local_508._9_7_;
      local_550.first.field_2._M_local_buf[10] = (char)((uint7)local_508._9_7_ >> 8);
      local_550.first.field_2._M_local_buf[0xb] = (char)((uint7)local_508._9_7_ >> 0x10);
      local_550.first.field_2._M_local_buf[0xc] = (char)((uint7)local_508._9_7_ >> 0x18);
      local_550.first.field_2._M_local_buf[0xd] = (char)((uint7)local_508._9_7_ >> 0x20);
      local_550.first.field_2._M_local_buf[0xe] = (char)((uint7)local_508._9_7_ >> 0x28);
      local_550.first.field_2._M_local_buf[0xf] = (char)((uint7)local_508._9_7_ >> 0x30);
    }
    else {
      local_550.first._M_dataplus._M_p = (pointer)local_518;
    }
    local_550.first._M_string_length = local_510;
    local_510 = 0;
    local_508._M_allocated_capacity = local_508._M_allocated_capacity & 0xffffffffffffff00;
    local_550.second = GVar13;
    local_518 = &local_508;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)&name_index_map,&local_550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
      operator_delete(local_550.first._M_dataplus._M_p,
                      CONCAT17(local_550.first.field_2._M_local_buf[7],
                               CONCAT16(local_550.first.field_2._M_local_buf[6],
                                        CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_550.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    if (local_518 != &local_508) {
      operator_delete(local_518,local_508._M_allocated_capacity + 1);
    }
    GVar13 = GVar13 + 1;
    pCVar18 = local_410;
  } while (GVar13 < buffer);
LAB_009b8302:
  paVar1 = &local_550.first.field_2;
  local_550.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_550.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_550.first.field_2._M_local_buf[6] = 'e';
  local_550.first.field_2._M_local_buf[7] = '_';
  local_550.first.field_2._M_local_buf[8] = 'c';
  local_550.first.field_2._M_local_buf[9] = 'u';
  local_550.first.field_2._M_local_buf[10] = 'b';
  local_550.first.field_2._M_local_buf[0xb] = 'e';
  local_550.first._M_string_length = 0xc;
  local_550.first.field_2._M_local_buf[0xc] = '\0';
  local_550.first._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x9066,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  local_550.first._M_dataplus._M_p = (pointer)&local_550.first.field_2;
  name[0] = '\x12';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_550.first._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)name);
  local_550.first.field_2._M_allocated_capacity._0_4_ = (undefined4)name._0_8_;
  local_550.first.field_2._M_allocated_capacity._4_2_ = SUB82(name._0_8_,4);
  local_550.first.field_2._M_local_buf[6] = SUB81(name._0_8_,6);
  local_550.first.field_2._M_local_buf[7] = SUB81(name._0_8_,7);
  builtin_strncpy(local_550.first._M_dataplus._M_p,"g_image_cube_array",0x12);
  local_550.first._M_string_length._0_1_ = name[0];
  local_550.first._M_string_length._1_1_ = name[1];
  local_550.first._M_string_length._2_1_ = name[2];
  local_550.first._M_string_length._3_1_ = name[3];
  local_550.first._M_string_length._4_1_ = name[4];
  local_550.first._M_string_length._5_1_ = name[5];
  local_550.first._M_string_length._6_1_ = name[6];
  local_550.first._M_string_length._7_1_ = name[7];
  local_550.first._M_dataplus._M_p[name._0_8_] = '\0';
  bVar4 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_520->super_ShaderImageLoadStoreBase,GVar9,&local_550.first,
                     &name_index_map,0x906a,GVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550.first._M_dataplus._M_p != &local_550.first.field_2) {
    operator_delete(local_550.first._M_dataplus._M_p,
                    CONCAT17(local_550.first.field_2._M_local_buf[7],
                             CONCAT16(local_550.first.field_2._M_local_buf[6],
                                      CONCAT24(local_550.first.field_2._M_allocated_capacity._4_2_,
                                               local_550.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  glu::CallLogWrapper::glUseProgram(pCVar18,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar18,GVar9);
  glu::CallLogWrapper::glDeleteTextures(pCVar18,2,(GLuint *)&data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (textures._0_8_ != 0) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) -
                    textures._0_8_);
  }
  return (ulong)((byte)local_1e0._0_4_ & bVar3 & bVar4) - 1;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!Read(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!Read(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		if (!ReadCube(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!ReadCube(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!ReadCube(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		return NO_ERROR;
	}